

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::GetPreprocessedFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *config)

{
  pointer pcVar1;
  cmLocalNinjaGenerator *pcVar2;
  int iVar3;
  string *psVar4;
  cmGlobalNinjaGenerator *pcVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string ppExt;
  string ppName;
  string local_188;
  long *local_168;
  undefined8 local_160;
  long local_158 [2];
  long *local_148;
  pointer local_140;
  long local_138 [2];
  string local_128;
  string local_108;
  string local_e8;
  undefined1 **local_c8;
  pointer local_c0;
  undefined1 *local_b8;
  undefined1 local_b0 [32];
  string local_90;
  long *local_70;
  long **local_68;
  char *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined8 local_50;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  
  psVar4 = cmSourceFile::GetExtension_abi_cxx11_(source);
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,pcVar1,pcVar1 + psVar4->_M_string_length);
  local_90._M_dataplus._M_p = (pointer)local_188._M_string_length;
  local_90._M_string_length = (size_type)local_188._M_dataplus._M_p;
  __str._M_str = "F";
  __str._M_len = 1;
  iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_90,0,1,__str);
  if (iVar3 == 0) {
    cmsys::SystemTools::LowerCase(&local_90,&local_188);
    std::__cxx11::string::operator=((string *)&local_188,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_188);
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_188,0,(char *)local_188._M_string_length,0x9e866b);
  }
  psVar4 = cmGeneratorTarget::GetObjectName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget,source);
  pcVar5 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
  cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
            (&local_e8,(cmGlobalGenerator *)pcVar5,source);
  if (local_e8._M_string_length <= psVar4->_M_string_length) {
    std::__cxx11::string::substr((ulong)&local_c8,(ulong)psVar4);
    local_90._M_dataplus._M_p = local_c0;
    local_90._M_string_length = (size_type)local_c8;
    local_90.field_2._8_8_ = 4;
    local_70 = (long *)0x964b05;
    local_68 = (long **)0x0;
    local_60 = (char *)local_188._M_string_length;
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_188._M_dataplus._M_p;
    local_50 = 0;
    views._M_len = 3;
    views._M_array = (iterator)&local_90;
    local_90.field_2._M_allocated_capacity = (size_type)&local_c8;
    cmCatViews(&local_108,views);
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,(ulong)(local_b8 + 1));
    }
    pcVar2 = this->LocalGenerator;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pcVar2->HomeRelativeOutputPath)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,
               pcVar1 + (pcVar2->HomeRelativeOutputPath)._M_string_length);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
      super_cmOutputConverter._vptr_cmOutputConverter[0x10])
              (&local_148,this->LocalGenerator,(this->super_cmCommonTargetGenerator).GeneratorTarget
              );
    pcVar5 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    (*(pcVar5->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d])
              (&local_168,pcVar5,config);
    local_90._M_dataplus._M_p = local_140;
    local_90._M_string_length = (size_type)local_148;
    local_90.field_2._8_8_ = local_160;
    local_70 = local_168;
    local_b8 = local_b0;
    local_c8 = (undefined1 **)0x0;
    local_c0 = (pointer)0x1;
    local_b0[0] = 0x2f;
    local_60 = (char *)0x1;
    local_50 = 0;
    local_48 = local_108._M_string_length;
    local_40 = local_108._M_dataplus._M_p;
    local_38 = 0;
    views_00._M_len = 4;
    views_00._M_array = (iterator)&local_90;
    local_90.field_2._M_allocated_capacity = (size_type)&local_148;
    local_68 = &local_168;
    local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_b8;
    cmCatViews(&local_128,views_00);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_128._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    if (local_168 != local_158) {
      operator_delete(local_168,local_158[0] + 1);
    }
    if (local_148 != local_138) {
      operator_delete(local_148,local_138[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("objName.size() >= objExt.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaTargetGenerator.cxx"
                ,0x1eb,
                "std::string cmNinjaTargetGenerator::GetPreprocessedFilePath(const cmSourceFile *, const std::string &) const"
               );
}

Assistant:

std::string cmNinjaTargetGenerator::GetPreprocessedFilePath(
  cmSourceFile const* source, const std::string& config) const
{
  // Choose an extension to compile already-preprocessed source.
  std::string ppExt = source->GetExtension();
  if (cmHasLiteralPrefix(ppExt, "F")) {
    // Some Fortran compilers automatically enable preprocessing for
    // upper-case extensions.  Since the source is already preprocessed,
    // use a lower-case extension.
    ppExt = cmSystemTools::LowerCase(ppExt);
  }
  if (ppExt == "fpp") {
    // Some Fortran compilers automatically enable preprocessing for
    // the ".fpp" extension.  Since the source is already preprocessed,
    // use the ".f" extension.
    ppExt = "f";
  }

  // Take the object file name and replace the extension.
  std::string const& objName = this->GeneratorTarget->GetObjectName(source);
  std::string const& objExt =
    this->GetGlobalGenerator()->GetLanguageOutputExtension(*source);
  assert(objName.size() >= objExt.size());
  std::string const ppName =
    cmStrCat(objName.substr(0, objName.size() - objExt.size()), "-pp.", ppExt);

  std::string path = this->LocalGenerator->GetHomeRelativeOutputPath();
  if (!path.empty()) {
    path += '/';
  }
  path +=
    cmStrCat(this->LocalGenerator->GetTargetDirectory(this->GeneratorTarget),
             this->GetGlobalGenerator()->ConfigDirectory(config), '/', ppName);
  return path;
}